

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O3

void __thiscall
copy_on_write<IntermediateBaseB>::copy_on_write<MultiplyDerived,void>
          (copy_on_write<IntermediateBaseB> *this,copy_on_write<MultiplyDerived> *p)

{
  MultiplyDerived *pMVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_control_block<IntermediateBaseB> *__tmp;
  IntermediateBaseB *pIVar2;
  copy_on_write<MultiplyDerived> tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  undefined1 local_19;
  
  this->ptr_ = (IntermediateBaseB *)0x0;
  (this->cb_).
  super___shared_ptr<shared_control_block<IntermediateBaseB>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->cb_).
  super___shared_ptr<shared_control_block<IntermediateBaseB>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pMVar1 = p->ptr_;
  tmp.ptr_ = (MultiplyDerived *)
             (p->cb_).
             super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  tmp.cb_.super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (p->cb_).
           super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      tmp.cb_.super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      tmp.cb_.super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           tmp.cb_.
           super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      tmp.cb_.super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           tmp.cb_.
           super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->_M_use_count + 1;
    }
  }
  pIVar2 = (IntermediateBaseB *)&(pMVar1->super_IntermediateBaseA).field_0x10;
  if (pMVar1 == (MultiplyDerived *)0x0) {
    pIVar2 = (IntermediateBaseB *)0x0;
  }
  this->ptr_ = pIVar2;
  tmp.cb_.super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<delegating_shared_control_block<IntermediateBaseB,MultiplyDerived>,std::allocator<delegating_shared_control_block<IntermediateBaseB,MultiplyDerived>>,std::shared_ptr<shared_control_block<MultiplyDerived>>>
            (&local_28,
             (delegating_shared_control_block<IntermediateBaseB,_MultiplyDerived> **)
             &tmp.cb_.
              super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (allocator<delegating_shared_control_block<IntermediateBaseB,_MultiplyDerived>_> *)
             &local_19,(shared_ptr<shared_control_block<MultiplyDerived>_> *)&tmp);
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  (this->cb_).
  super___shared_ptr<shared_control_block<IntermediateBaseB>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       tmp.cb_.super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  this_00 = (this->cb_).
            super___shared_ptr<shared_control_block<IntermediateBaseB>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->cb_).
  super___shared_ptr<shared_control_block<IntermediateBaseB>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_28._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  if (tmp.cb_.super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tmp.cb_.
               super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  return;
}

Assistant:

copy_on_write(const copy_on_write<U>& p)
  {
    copy_on_write<U> tmp(p);
    ptr_ = tmp.ptr_;
    cb_ = std::static_pointer_cast<shared_control_block<T>>(
        std::make_shared<delegating_shared_control_block<T, U>>(
            std::move(tmp.cb_)));
  }